

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
ChainstateManager::ProcessNewBlockHeaders
          (ChainstateManager *this,span<const_CBlockHeader,_18446744073709551615UL> headers,
          bool min_pow_checked,BlockValidationState *state,CBlockIndex **ppindex)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  seconds sVar3;
  long *plVar4;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long *in_R9;
  long in_FS_OFFSET;
  char *pcVar5;
  CBlockIndex *last_accepted;
  bool accepted;
  CBlockHeader *header;
  span<const_CBlockHeader,_18446744073709551615UL> *__range1;
  undefined7 in_stack_00000088;
  double progress;
  int64_t blocks_left;
  CBlockIndex *pindex;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  ChainstateManager *in_stack_00000138;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  Params *in_stack_fffffffffffffed0;
  CBlockIndex *in_stack_fffffffffffffed8;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  ChainstateManager *in_stack_ffffffffffffff08;
  reference in_stack_ffffffffffffff30;
  undefined1 *puVar6;
  int source_line;
  byte local_99;
  ChainstateManager *in_stack_ffffffffffffff70;
  ConstevalFormatString<2U> in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  size_t sVar7;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffecc,(RecursiveMutex *)0x7e33a8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff08,in_RDI,
             (char *)CONCAT17(in_stack_fffffffffffffeff,
                              CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
             in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             SUB41((uint)in_stack_fffffffffffffee8 >> 0x18,0));
  puVar6 = local_28;
  std::span<const_CBlockHeader,_18446744073709551615UL>::begin
            ((span<const_CBlockHeader,_18446744073709551615UL> *)in_stack_fffffffffffffed0);
  std::span<const_CBlockHeader,_18446744073709551615UL>::end
            ((span<const_CBlockHeader,_18446744073709551615UL> *)in_stack_fffffffffffffed8);
  do {
    bVar2 = __gnu_cxx::
            operator==<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                      ((__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffed8,
                       (__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffed0);
    source_line = (int)((ulong)puVar6 >> 0x20);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = false;
LAB_007e3503:
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if (!bVar2) {
        bVar2 = NotifyHeaderTip(in_stack_ffffffffffffff08);
        if ((((bVar2) && (bVar2 = IsInitialBlockDownload(in_stack_ffffffffffffff70), bVar2)) &&
            (in_R9 != (long *)0x0)) && (*in_R9 != 0)) {
          lVar1 = *in_R9;
          NodeClock::now();
          CBlockIndex::Time(in_stack_fffffffffffffed8);
          std::chrono::operator-
                    ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffed0,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          GetConsensus((ChainstateManager *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          sVar3 = Consensus::Params::PowTargetSpacing(in_stack_fffffffffffffed0);
          std::chrono::operator/
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     in_stack_fffffffffffffee0);
          sVar7 = 0;
          plVar4 = std::max<long>((long *)in_stack_fffffffffffffed0,
                                  (long *)CONCAT44(in_stack_fffffffffffffecc,
                                                   in_stack_fffffffffffffec8));
          pcVar5 = (char *)(((double)*(int *)(lVar1 + 0x18) * 100.0) /
                           (double)((long)*(int *)(lVar1 + 0x18) + *plVar4));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (char *)in_stack_fffffffffffffee0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (char *)in_stack_fffffffffffffee0);
          logging_function._M_str = (char *)sVar3.__r;
          logging_function._M_len = sVar7;
          source_file._M_str = pcVar5;
          source_file._M_len = in_stack_ffffffffffffff80;
          LogPrintFormatInternal<int,double>
                    (logging_function,source_file,source_line,(LogFlags)in_stack_ffffffffffffff30,
                     (Level)__range1,in_stack_ffffffffffffff78,(int *)state,
                     (double *)CONCAT17(min_pow_checked,in_stack_00000088));
        }
        local_99 = 1;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (bool)(local_99 & 1);
    }
    in_stack_ffffffffffffff30 =
         __gnu_cxx::
         __normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
         ::operator*((__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                      *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    bVar2 = AcceptBlockHeader((ChainstateManager *)state,(CBlockHeader *)ppindex,
                              (BlockValidationState *)CONCAT44(__range1._4_4_,(Level)__range1),
                              (CBlockIndex **)header,accepted);
    CheckBlockIndex(in_stack_00000138);
    source_line = (int)((ulong)puVar6 >> 0x20);
    if (!bVar2) {
      local_99 = 0;
      bVar2 = true;
      goto LAB_007e3503;
    }
    if (in_R9 != (long *)0x0) {
      *in_R9 = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_CBlockHeader_*,_std::span<const_CBlockHeader,_18446744073709551615UL>_>
                  *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  } while( true );
}

Assistant:

bool ChainstateManager::ProcessNewBlockHeaders(std::span<const CBlockHeader> headers, bool min_pow_checked, BlockValidationState& state, const CBlockIndex** ppindex)
{
    AssertLockNotHeld(cs_main);
    {
        LOCK(cs_main);
        for (const CBlockHeader& header : headers) {
            CBlockIndex *pindex = nullptr; // Use a temp pindex instead of ppindex to avoid a const_cast
            bool accepted{AcceptBlockHeader(header, state, &pindex, min_pow_checked)};
            CheckBlockIndex();

            if (!accepted) {
                return false;
            }
            if (ppindex) {
                *ppindex = pindex;
            }
        }
    }
    if (NotifyHeaderTip()) {
        if (IsInitialBlockDownload() && ppindex && *ppindex) {
            const CBlockIndex& last_accepted{**ppindex};
            int64_t blocks_left{(NodeClock::now() - last_accepted.Time()) / GetConsensus().PowTargetSpacing()};
            blocks_left = std::max<int64_t>(0, blocks_left);
            const double progress{100.0 * last_accepted.nHeight / (last_accepted.nHeight + blocks_left)};
            LogInfo("Synchronizing blockheaders, height: %d (~%.2f%%)\n", last_accepted.nHeight, progress);
        }
    }
    return true;
}